

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O1

void player_change_place(player *p,wchar_t place)

{
  short sVar1;
  level_conflict *plVar2;
  player_upkeep *ppVar3;
  char *pcVar4;
  level_conflict *lev;
  
  sVar1 = p->place;
  lev = world->levels + sVar1;
  if (p->last_place != sVar1) {
    p->last_place = sVar1;
  }
  if ((lev->locality & ~LOC_ERIADOR) == LOC_UNDERWORLD) {
    if (lev->up != (char *)0x0) {
      string_free(lev->up);
      lev->up = (char *)0x0;
    }
    if (lev->down != (char *)0x0) {
      string_free(lev->down);
      lev->down = (char *)0x0;
    }
    lev->depth = 0;
  }
  if (p->upkeep->arena_level == false) {
    p->place = (int16_t)place;
  }
  else {
    p->place = 0;
    world->levels->depth = lev->depth;
  }
  plVar2 = world->levels;
  sVar1 = p->place;
  if (plVar2[sVar1].locality == LOC_UNDERWORLD) {
    pcVar4 = level_name(lev);
    pcVar4 = string_make(pcVar4);
    plVar2[sVar1].up = pcVar4;
    plVar2[sVar1].depth = lev->depth;
  }
  if (plVar2[sVar1].locality == LOC_MOUNTAIN_TOP) {
    pcVar4 = level_name(lev);
    pcVar4 = string_make(pcVar4);
    plVar2[sVar1].down = pcVar4;
    plVar2[sVar1].depth = lev->depth;
  }
  sVar1 = (short)world->levels[place].depth;
  p->depth = sVar1;
  lev->visited = true;
  if ((sVar1 == 0) && (daycount != 0)) {
    store_update();
  }
  ppVar3 = p->upkeep;
  ppVar3->autosave = true;
  ppVar3->generate_level = true;
  return;
}

Assistant:

void player_change_place(struct player *p, int place)
{
	struct level *lev = &world->levels[p->place], *next_lev;

	/* Set last place (unless unchanged or arena) */
	if (p->last_place != p->place) {
		p->last_place = p->place;
	}

	/* Underworld and mountaintop levels need to be edited */
	if (lev->locality == LOC_UNDERWORLD || lev->locality == LOC_MOUNTAIN_TOP) {
		if (lev->up) {
			string_free(lev->up);
			lev->up = NULL;
		}
		if (lev->down) {
			string_free(lev->down);
			lev->down = NULL;
		}
		lev->depth = 0;
	}

	/* Set new place (unless arena) */
	if (!p->upkeep->arena_level) {
		p->place = place;
	} else {
		/* Arena is always 0 */
		p->place = 0;
		world->levels[p->place].depth = lev->depth; 
	}

	/* Underworld and mountaintop levels need to be edited */
	next_lev = &world->levels[p->place];
	if (next_lev->locality == LOC_UNDERWORLD) {
		next_lev->up = string_make(level_name(lev));
		next_lev->depth = lev->depth;
	}
	if (next_lev->locality == LOC_MOUNTAIN_TOP) {
		next_lev->down = string_make(level_name(lev));
		next_lev->depth = lev->depth;
	}

	p->depth = world->levels[place].depth;

	/* We've been here now */
	lev->visited = true;

	/* If we're returning to town, update the store contents
	   according to how long we've been away */
	if (!p->depth && daycount)
		store_update();

	/* Leaving, make new level */
	p->upkeep->generate_level = true;

	/* Save the game when we arrive on the new level. */
	p->upkeep->autosave = true;
}